

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertySet::~IfcPropertySet(IfcPropertySet *this,void **vtt)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper = pp_Var1;
  *(void **)((long)&(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot
                    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper +
            (long)pp_Var1[-3]) = vtt[0x12];
  *(void **)&(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
             field_0x88 = vtt[0x13];
  *(void **)&(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
             field_0x98 = vtt[0x14];
  *(void **)&(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.field_0xa8 =
       vtt[0x15];
  std::
  _Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
  ::~_Vector_base((_Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
                   *)&(this->super_IfcPropertySetDefinition).field_0xb8);
  IfcRoot::~IfcRoot((IfcRoot *)this,vtt + 3);
  return;
}

Assistant:

IfcPropertySet() : Object("IfcPropertySet") {}